

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeUpper(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newUpper,bool scale)

{
  uint *puVar1;
  bool bVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  int iVar12;
  ulong uVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  undefined7 in_register_00000009;
  cpp_dec_float<100U,_int,_void> local_138;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  undefined1 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar3 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
    local_138.data._M_elems._8_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
    local_138.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 8;
    local_138.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_138.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 0xc;
    local_138.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_138.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_138.exp = pnVar3[i].m_backend.exp;
    local_138.neg = pnVar3[i].m_backend.neg;
    uVar13._0_4_ = pnVar3[i].m_backend.fpclass;
    uVar13._4_4_ = pnVar3[i].m_backend.prec_elem;
    local_138._72_8_ = uVar13;
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upperUnscaled((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_138,
                    &this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,i);
    uVar13 = local_138._72_8_ & 0xffffffff;
  }
  if ((((newUpper->m_backend).fpclass != cpp_dec_float_NaN) && ((int)uVar13 != 2)) &&
     (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&newUpper->m_backend,&local_138), iVar12 == 0)) {
    return;
  }
  pcVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
  uVar4 = *(undefined8 *)((pcVar14->data)._M_elems + 2);
  uVar5 = *(undefined8 *)((pcVar14->data)._M_elems + 4);
  uVar6 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
  uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
  uVar8 = *(undefined8 *)((pcVar14->data)._M_elems + 10);
  uVar9 = *(undefined8 *)((pcVar14->data)._M_elems + 0xc);
  uVar10 = *(undefined8 *)((pcVar14->data)._M_elems + 0xe);
  *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems =
       *(undefined8 *)(pcVar14->data)._M_elems;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) = uVar4;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) = uVar5;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) = uVar6;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) = uVar7;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 10) = uVar8;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xc) = uVar9;
  *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 0xe) = uVar10;
  (this->m_nonbasicValue).m_backend.exp = pcVar14->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar14->neg;
  iVar11 = pcVar14->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar14->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar11;
  this->m_nonbasicValueUpToDate = false;
  pnVar3 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_138.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[i].m_backend.data;
  local_138.data._M_elems._8_8_ = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
  puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
  local_138.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_138.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar3[i].m_backend.data._M_elems + 8;
  local_138.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_138.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = pnVar3[i].m_backend.data._M_elems + 0xc;
  local_138.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  local_138.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  iVar12 = pnVar3[i].m_backend.exp;
  bVar2 = pnVar3[i].m_backend.neg;
  local_e8._0_4_ = pnVar3[i].m_backend.fpclass;
  local_e8._4_4_ = pnVar3[i].m_backend.prec_elem;
  uStack_e0 = 0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::changeUpper(&this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,i,newUpper,scale);
  if (NO_PROBLEM <
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus) {
    pnVar3 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = *(undefined8 *)&pnVar3[i].m_backend.data;
    uStack_80 = *(undefined8 *)(pnVar3[i].m_backend.data._M_elems + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 4;
    local_78 = *(undefined8 *)puVar1;
    uStack_70 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 8;
    local_68 = *(undefined8 *)puVar1;
    uStack_60 = *(undefined8 *)(puVar1 + 2);
    puVar1 = pnVar3[i].m_backend.data._M_elems + 0xc;
    local_58 = *(undefined8 *)puVar1;
    uStack_50 = *(undefined8 *)(puVar1 + 2);
    local_48 = pnVar3[i].m_backend.exp;
    local_44 = pnVar3[i].m_backend.neg;
    local_40._0_4_ = pnVar3[i].m_backend.fpclass;
    local_40._4_4_ = pnVar3[i].m_backend.prec_elem;
    local_d8[0] = local_138.data._M_elems[0];
    local_d8[1] = local_138.data._M_elems[1];
    auStack_d0[0] = local_138.data._M_elems[2];
    auStack_d0[1] = local_138.data._M_elems[3];
    local_c8 = local_138.data._M_elems[4];
    uStack_c4 = local_138.data._M_elems[5];
    uStack_c0 = local_138.data._M_elems[6];
    uStack_bc = local_138.data._M_elems[7];
    local_b8 = local_138.data._M_elems[8];
    uStack_b4 = local_138.data._M_elems[9];
    uStack_b0 = local_138.data._M_elems[10];
    uStack_ac = local_138.data._M_elems[0xb];
    local_a8 = local_138.data._M_elems[0xc];
    uStack_a4 = local_138.data._M_elems[0xd];
    uStack_a0 = local_138.data._M_elems[0xe];
    uStack_9c = local_138.data._M_elems[0xf];
    local_90 = (undefined4)local_e8;
    uStack_8c = local_e8._4_4_;
    local_98 = iVar12;
    local_94 = bVar2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x6a])(this,i);
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x77])(this);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeUpper(int i, const R& newUpper, bool scale)
{
   if(newUpper != (scale ? this->upperUnscaled(i) : this->upper(i)))
   {
      forceRecompNonbasicValue();

      R oldUpper = this->upper(i);
      SPxLPBase<R>::changeUpper(i, newUpper, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeUpperStatus(i, this->upper(i), oldUpper);
         unInit();
      }
   }
}